

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.h
# Opt level: O2

void __thiscall minihttp::Request::~Request(Request *this)

{
  std::__cxx11::string::~string((string *)&this->post);
  std::__cxx11::string::~string((string *)&this->extraGetHeaders);
  std::__cxx11::string::~string((string *)&this->resource);
  std::__cxx11::string::~string((string *)&this->header);
  std::__cxx11::string::~string((string *)&this->host);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Request() : port(80), user(NULL) {}